

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O3

bool __thiscall wmj::fileWatcher::fileWatcher::watchOnce(fileWatcher *this)

{
  int iVar1;
  int *__buf;
  ssize_t sVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  
  __buf = (int *)operator_new__((this->file_name)._M_string_length * 10 + 0xaa);
  sVar2 = read(this->inotify_fd,__buf,100);
  uVar3 = 0;
  if (0 < sVar2) {
    piVar4 = __buf;
    do {
      if (*piVar4 == this->wd) {
        uVar3 = uVar3 | piVar4[1];
      }
      piVar4 = (int *)((long)piVar4 + (ulong)(uint)piVar4[3] + 0x10);
    } while (piVar4 < (int *)((long)__buf + sVar2));
    bVar5 = true;
    if ((uVar3 & 0x8008) == 8) goto LAB_00102a3a;
    if ((uVar3 & 0xc04) != 0) {
      bVar5 = (uVar3 & 0xc00) != 0;
      inotify_rm_watch(this->inotify_fd,this->wd);
      iVar1 = inotify_add_watch(this->inotify_fd,(this->file_name)._M_dataplus._M_p,0xc0c);
      this->wd = iVar1;
      goto LAB_00102a3a;
    }
  }
  bVar5 = false;
LAB_00102a3a:
  operator_delete__(__buf);
  return bVar5;
}

Assistant:

bool fileWatcher::watchOnce() {
    char *a = new char[(10 * (sizeof(struct inotify_event) + file_name.size() + 1))];
    auto readnum = read(inotify_fd, a, 100);
    if(readnum > 0) {
        unsigned int mask  = 0;
        for(auto c = a; c < a + readnum;) {
            auto event = (struct inotify_event *) c;
            if(event->wd == this->wd) {
                mask |= event->mask;
            }
            c += sizeof(struct inotify_event) + event->len;
        }
        if((mask & IN_IGNORED) == 0 &&
                (mask & IN_CLOSE_WRITE)) {
            // 在文件被写入关闭或者文件被覆盖的时候说明文件被修改
            delete[] a;
            return true;
        } else if(mask & IN_DELETE_SELF  || mask & IN_MOVE_SELF) {
            // 如果你使用mv命令覆盖文件，文件
            // 只是发生了一次没有读入的写,此
            // 时只会触发此处
            stopWatch();
            startWatch();
            delete[] a;
            return true;
        } else if(mask & IN_ATTRIB) {
            // 一些编辑器(比如vim)使用文件覆盖的方法
            // 写入文件，此时需要重新启动一次读
            stopWatch();
            startWatch();
            delete[] a;
            return false;
        }

    }
    delete[] a;
    return false;
}